

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  key_type *__k;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  string *psVar11;
  TemplateRecord *pTVar12;
  long lVar13;
  const_iterator cVar14;
  TemplateRecord **ppTVar15;
  uint uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  ulong uVar18;
  char *__end;
  long lVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  uint uVar20;
  bool bVar21;
  vector<TemplateRecord_*,_std::allocator<TemplateRecord_*>_> template_records;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_seen;
  TemplateRecord *template_rec;
  string all_header_entries;
  string cleantext;
  string output;
  string FLAG_template_dir;
  string FLAG_outputfile;
  string FLAG_header_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  template_filenames;
  string FLAG_outputfile_suffix;
  int option_index;
  string progname;
  TemplateRecord **local_1f8;
  iterator iStack_1f0;
  TemplateRecord **local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Base_ptr local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  string local_168;
  char **local_148;
  ulong local_140;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_54 [4];
  string local_50;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  sVar10 = strlen((char *)&ctemplate::kCWD);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,&ctemplate::kCWD,(long)&ctemplate::kCWD + sVar10);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,&ctemplate::kCWD,(long)&ctemplate::kCWD + sVar10);
  ctemplate::NormalizeDirectory((string *)&local_d8);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".varnames.h","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  bVar8 = true;
  local_140 = 0;
  bVar21 = true;
  do {
    iVar9 = getopt_long(argc,argv,"t:o:s:f:ndqhV",main::longopts,local_54);
    pcVar5 = _optarg;
    if (0x10 < iVar9 - 100U) {
      if (iVar9 != -1) {
        if (iVar9 == 0x56) {
          fwrite("make_tpl_varnames_h  (part of ctemplate 2.3.0)\n\nCopyright 1998 Google Inc.\n\nThis is BSD licensed software; see the source for copying conditions\nand license information.\nThere is NO warranty; not even for MERCHANTABILITY or FITNESS FOR A\nPARTICULAR PURPOSE.\n"
                 ,0x102,1,_stdout);
          goto LAB_00103d58;
        }
        goto switchD_0010362a_caseD_65;
      }
      goto LAB_001036b5;
    }
    pbVar17 = &local_d8;
    switch(iVar9) {
    case 100:
      local_140 = CONCAT71((int7)((ulong)((long)&switchD_0010362a::switchdataD_00106020 +
                                         (long)(int)(&switchD_0010362a::switchdataD_00106020)
                                                    [iVar9 - 100U]) >> 8),1);
      goto LAB_001036b5;
    default:
switchD_0010362a_caseD_65:
      Usage(*argv,_stderr);
      uVar16 = 1;
      goto LAB_00103eae;
    case 0x66:
      pbVar17 = &local_f8;
      break;
    case 0x68:
      Usage(*argv,_stderr);
LAB_00103d58:
      uVar16 = 0;
      goto LAB_00103eae;
    case 0x6e:
      bVar21 = false;
      goto LAB_001036b5;
    case 0x6f:
      break;
    case 0x71:
      bVar8 = false;
      goto LAB_001036b5;
    case 0x73:
      pbVar17 = &local_78;
      break;
    case 0x74:
      pbVar17 = &local_118;
    }
    pcVar2 = (char *)pbVar17->_M_string_length;
    strlen(_optarg);
    std::__cxx11::string::_M_replace((ulong)pbVar17,0,pcVar2,(ulong)pcVar5);
LAB_001036b5:
  } while (iVar9 != -1);
  if (argc <= _optind) {
    LogPrintf(3,(uint)bVar8,"Must specify at least one template file on the command line.");
  }
  local_148 = argv;
  psVar11 = (string *)ctemplate::mutable_default_template_cache();
  ctemplate::TemplateCache::SetTemplateRootDirectory(psVar11);
  local_1f8 = (TemplateRecord **)0x0;
  iStack_1f0._M_current = (TemplateRecord **)0x0;
  local_1e8 = (TemplateRecord **)0x0;
  if (_optind < argc) {
    ppcVar1 = local_148 + _optind;
    iVar9 = argc - _optind;
    lVar19 = 0;
    do {
      pTVar12 = (TemplateRecord *)operator_new(0x48);
      std::__cxx11::string::string((string *)local_1d8,ppcVar1[lVar19],(allocator *)&local_50);
      (pTVar12->name)._M_dataplus._M_p = (pointer)&(pTVar12->name).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)pTVar12,local_1d8._0_8_,(char *)(local_1d8._0_8_ + local_1d8._8_8_));
      pTVar12->error = false;
      (pTVar12->header_entries)._M_dataplus._M_p = (pointer)&(pTVar12->header_entries).field_2;
      (pTVar12->header_entries)._M_string_length = 0;
      (pTVar12->header_entries).field_2._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_);
      }
      local_1a8._0_8_ = pTVar12;
      if (iStack_1f0._M_current == local_1e8) {
        std::vector<TemplateRecord*,std::allocator<TemplateRecord*>>::
        _M_realloc_insert<TemplateRecord*const&>
                  ((vector<TemplateRecord*,std::allocator<TemplateRecord*>> *)&local_1f8,iStack_1f0,
                   (TemplateRecord **)local_1a8);
      }
      else {
        *iStack_1f0._M_current = pTVar12;
        iStack_1f0._M_current = iStack_1f0._M_current + 1;
      }
      lVar19 = lVar19 + 1;
    } while (iVar9 != (int)lVar19);
  }
  if (local_1f8 == iStack_1f0._M_current) {
    uVar20 = 0;
  }
  else {
    uVar20 = 0;
    ppTVar15 = local_1f8;
    do {
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((*ppTVar15)->name)._M_dataplus._M_p;
      LogPrintf(0,(uint)bVar8,"\n------ Checking %s ------",paVar3);
      __s = paVar3;
      if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
        __s = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x106805;
      }
      local_1d8._0_8_ = __s;
      local_1d8._8_8_ = strlen(__s->_M_local_buf);
      local_1c8._M_local_buf[0] =
           __s < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&__data_start &&
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&UNK_0010341f < __s;
      local_1c8._8_8_ = (undefined1 *)0x0;
      psVar11 = (string *)ctemplate::Template::GetTemplate((TemplateString *)local_1d8,DO_NOT_STRIP)
      ;
      if (psVar11 == (string *)0x0) {
        LogPrintf(2,(uint)bVar8,"Could not load file: %s",paVar3);
        uVar20 = uVar20 + 1;
        (*ppTVar15)->error = true;
      }
      else {
        LogPrintf(0,(uint)bVar8,"No syntax errors detected in %s",paVar3);
        if ((local_140 & 1) != 0) {
          ctemplate::Template::template_file();
          ctemplate::Template::Dump((char *)psVar11);
        }
        if (bVar21) {
          ctemplate::Template::WriteHeaderEntries(psVar11);
        }
      }
      ppTVar15 = ppTVar15 + 1;
    } while (ppTVar15 != iStack_1f0._M_current);
  }
  ppTVar15 = local_1f8;
  if (bVar21) {
    std::__cxx11::string::string((string *)&local_50,*local_148,(allocator *)local_1d8);
    if (local_f8._M_string_length == 0) {
      if (local_1f8 != iStack_1f0._M_current) {
        ppTVar15 = local_1f8;
        do {
          if ((*ppTVar15)->error == false) {
            ctemplate::Basename((string *)local_1d8);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_188,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8,&local_78);
            ctemplate::PathJoin((string *)local_1a8,(string *)&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_allocated_capacity != &local_178) {
              operator_delete((void *)local_188._M_allocated_capacity);
            }
            local_168._M_dataplus._M_p = (pointer)0x0;
            local_168._M_string_length = 0;
            local_168.field_2._0_8_ = 0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_168,&(*ppTVar15)->name);
            Boilerplate((string *)&local_188,&local_50,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_168);
            WrapWithGuard(&local_138,(string *)local_1a8,&(*ppTVar15)->header_entries);
            std::__cxx11::string::_M_append
                      (local_188._M_local_buf,(ulong)local_138._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p);
            }
            bVar21 = WriteToDisk(bVar8,(string *)local_1a8,(string *)&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_allocated_capacity != &local_178) {
              operator_delete((void *)local_188._M_allocated_capacity);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_168);
            if ((TemplateRecord *)local_1a8._0_8_ != (TemplateRecord *)(local_1a8 + 0x10)) {
              operator_delete((void *)local_1a8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_ != &local_1c8) {
              operator_delete((void *)local_1d8._0_8_);
            }
            uVar20 = uVar20 + !bVar21;
          }
          ppTVar15 = ppTVar15 + 1;
        } while (ppTVar15 != iStack_1f0._M_current);
      }
    }
    else if (uVar20 == 0) {
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_188._M_allocated_capacity = (size_type)&local_178;
      local_188._8_8_ = 0;
      local_178._M_local_buf[0] = '\0';
      if (local_1f8 != iStack_1f0._M_current) {
        ppTVar15 = local_1f8;
        do {
          std::__cxx11::string::_M_append
                    (local_188._M_local_buf,(ulong)((*ppTVar15)->header_entries)._M_dataplus._M_p);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_b8,&(*ppTVar15)->name);
          ppTVar15 = ppTVar15 + 1;
        } while (ppTVar15 != iStack_1f0._M_current);
      }
      Boilerplate(&local_138,&local_50,&local_b8);
      uVar6 = local_188._8_8_;
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      local_168._M_string_length = 0;
      local_168.field_2._0_8_ = local_168.field_2._0_8_ & 0xffffffffffffff00;
      local_1c8._8_8_ = local_1d8 + 8;
      local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
      local_1c8._M_allocated_capacity = 0;
      local_1b0 = 0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8 = (_Base_ptr)local_1c8._8_8_;
      do {
        lVar19 = std::__cxx11::string::find((char)&local_188,10);
        if (lVar19 == -1) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_188);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
          ;
          if ((TemplateRecord *)local_1a8._0_8_ != (TemplateRecord *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_);
          }
          bVar21 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)&local_188);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8)
          ;
          if ((TemplateRecord *)local_1a8._0_8_ != (TemplateRecord *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_);
          }
          bVar21 = lVar19 + 1U < (ulong)uVar6;
        }
      } while (bVar21);
      uVar16 = (uint)((ulong)((long)local_98.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_98.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (0 < (int)uVar16) {
        uVar18 = (ulong)(uVar16 & 0x7fffffff);
        lVar19 = 0;
        do {
          pbVar7 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (LineIsAllWhitespace(std::__cxx11::string_const&)::kWhitespace_abi_cxx11_ == '\0') {
            main_cold_1();
          }
          __k = (key_type *)((long)&(pbVar7->_M_dataplus)._M_p + lVar19);
          lVar13 = std::__cxx11::string::find_first_not_of
                             ((char *)__k,
                              LineIsAllWhitespace(std::__cxx11::string_const&)::
                              kWhitespace_abi_cxx11_,0);
          if ((lVar13 == -1) ||
             (cVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1d8,__k), cVar14._M_node == (_Base_ptr)(local_1d8 + 8))) {
            std::__cxx11::string::_M_append
                      ((char *)&local_168,*(ulong *)((long)&(pbVar7->_M_dataplus)._M_p + lVar19));
            std::__cxx11::string::append((char *)&local_168);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_1d8,__k);
          }
          lVar19 = lVar19 + 0x20;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1d8);
      WrapWithGuard((string *)local_1d8,&local_f8,&local_168);
      std::__cxx11::string::_M_append((char *)&local_138,local_1d8._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_);
      }
      bVar8 = WriteToDisk(bVar8,&local_f8,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_allocated_capacity != &local_178) {
        operator_delete((void *)local_188._M_allocated_capacity);
      }
      uVar20 = (uint)!bVar8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b8);
    }
    ppTVar15 = local_1f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      ppTVar15 = local_1f8;
    }
  }
  for (; ppTVar15 != iStack_1f0._M_current; ppTVar15 = ppTVar15 + 1) {
    pTVar12 = *ppTVar15;
    if (pTVar12 != (TemplateRecord *)0x0) {
      pcVar4 = (pTVar12->header_entries)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &(pTVar12->header_entries).field_2) {
        operator_delete(pcVar4);
      }
      pcVar4 = (pTVar12->name)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &(pTVar12->name).field_2) {
        operator_delete(pcVar4);
      }
      operator_delete(pTVar12);
    }
  }
  uVar16 = 0x7f;
  if ((int)uVar20 < 0x7f) {
    uVar16 = uVar20;
  }
  if (local_1f8 != (TemplateRecord **)0x0) {
    operator_delete(local_1f8);
  }
LAB_00103eae:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return uVar16;
}

Assistant:

int main(int argc, char **argv) {
  string FLAG_template_dir(GOOGLE_NAMESPACE::kCWD);   // "./"
  string FLAG_header_dir(GOOGLE_NAMESPACE::kCWD);
  GOOGLE_NAMESPACE::NormalizeDirectory(&FLAG_header_dir);   // adds trailing slash
  string FLAG_outputfile_suffix(".varnames.h");
  string FLAG_outputfile("");
  bool FLAG_header = true;
  bool FLAG_dump_templates = false;
  bool FLAG_log_info = true;

#if defined(HAVE_GETOPT_LONG)
  static struct option longopts[] = {
    {"help", 0, NULL, 'h'},
    {"version", 0, NULL, 'V'},
    {"template_dir", 1, NULL, 't'},
    {"header_dir", 1, NULL, 'o'},
    {"outputfile_suffix", 1, NULL, 's'},
    {"outputfile", 1, NULL, 'f'},
    {"noheader", 0, NULL, 'n'},
    {"dump_templates", 0, NULL, 'd'},
    {"nolog_info", 0, NULL, 'q'},
    {"v", 1, NULL, 'q'},
    {0, 0, 0, 0}
  };
  int option_index;
# define GETOPT(argc, argv)  getopt_long(argc, argv, "t:o:s:f:ndqhV", \
                                         longopts, &option_index)
#elif defined(HAVE_GETOPT_H)
# define GETOPT(argc, argv)  getopt(argc, argv, "t:o:s:f:ndqhV")
#else    // TODO(csilvers): implement something reasonable for windows
# define GETOPT(argc, argv)  -1
  int optind = 1;    // first non-opt argument
  const char* optarg = "";   // not used
#endif

  int r = 0;
  while (r != -1) {   // getopt()/getopt_long() return -1 upon no-more-input
    r = GETOPT(argc, argv);
    switch (r) {
      case 't': FLAG_template_dir.assign(optarg); break;
      case 'o': FLAG_header_dir.assign(optarg); break;
      case 's': FLAG_outputfile_suffix.assign(optarg); break;
      case 'f': FLAG_outputfile.assign(optarg); break;
      case 'n': FLAG_header = false; break;
      case 'd': FLAG_dump_templates = true; break;
      case 'q': FLAG_log_info = false; break;
      case 'V': Version(stdout); return 0; break;
      case 'h': Usage(argv[0], stderr); return 0; break;
      case -1: break;   // means 'no more input'
      default: Usage(argv[0], stderr); return 1; break;
    }
  }

  if (optind >= argc) {
    LogPrintf(LOG_FATAL, FLAG_log_info,
              "Must specify at least one template file on the command line.");
  }

  Template::SetTemplateRootDirectory(FLAG_template_dir);


  // Initialize the TemplateRecord array. It holds one element per
  // template given on the command-line.
  vector<TemplateRecord*> template_records;
  for (int i = optind; i < argc; ++i) {
    TemplateRecord *template_rec = new TemplateRecord(argv[i]);
    template_records.push_back(template_rec);
  }

  // Iterate through each template and (unless -n is given), write
  // its header entries into the headers array.
  int num_errors = 0;
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    const char* tplname = (*it)->name.c_str();
    LogPrintf(LOG_INFO, FLAG_log_info, "\n------ Checking %s ------", tplname);

    // The last two arguments in the following call do not matter
    // since they control how the template gets expanded and we never
    // expand the template after loading it here
    Template * tpl = Template::GetTemplate(tplname, GOOGLE_NAMESPACE::DO_NOT_STRIP);

    // The call to GetTemplate (above) loads the template from disk
    // and attempts to parse it. If it cannot find the file or if it
    // detects any template syntax errors, the parsing routines
    // report the error and GetTemplate returns NULL. Syntax errors
    // include such things as mismatched double-curly-bracket pairs,
    // e.g. '{{VAR}', Invalid characters in template variables or
    // section names, e.g.  '{{BAD_VAR?}}' [the question mark is
    // illegal], improperly nested section/end section markers,
    // e.g. a section close marker with no section start marker or a
    // section start of a different name.
    // If that happens, since the parsing errors have already been reported
    // we just continue on to the next one.
    if (!tpl) {
      LogPrintf(LOG_ERROR, FLAG_log_info, "Could not load file: %s", tplname);
      num_errors++;
      (*it)->error = true;
      continue;
    } else {
      LogPrintf(LOG_INFO, FLAG_log_info, "No syntax errors detected in %s",
                tplname);
      if (FLAG_dump_templates)
        tpl->Dump(tpl->template_file());
    }

    // The rest of the loop creates the header file
    if (!FLAG_header)
      continue;            // They don't want header files

    tpl->WriteHeaderEntries(&((*it)->header_entries));
  }

  // We have headers to emit:
  // . If --outputfile was given, we combine all the header entries and
  //   write them to the given output file. If any template had errors,
  //   we fail and do not generate an output file.
  // . Otherwise, we write one output file per template we processed.
  // . In both cases, we add proper boilerplate first.
  if (FLAG_header) {
    string progname = argv[0];

    if (!FLAG_outputfile.empty()) {  // All header entries written to one file.
      // If any template had an error, we do not produce an output file.
      if (num_errors == 0) {
        vector<string> template_filenames;
        string all_header_entries;
        for (vector<TemplateRecord*>::const_iterator
             it = template_records.begin(); it != template_records.end(); ++it) {
          all_header_entries.append((*it)->header_entries);
          template_filenames.push_back((*it)->name);
        }
        string output = Boilerplate(progname, template_filenames);
        const string cleantext =
            TextWithDuplicateLinesRemoved(all_header_entries);
        output.append(WrapWithGuard(FLAG_outputfile, cleantext));
        if (!WriteToDisk(FLAG_log_info, FLAG_outputfile, output))
          num_errors++;
      }
    } else {
      // Each template will have its own output file. Skip any that had errors.
      for (vector<TemplateRecord*>::const_iterator
           it = template_records.begin(); it != template_records.end(); ++it) {
        if ((*it)->error)
          continue;
        string basename = GOOGLE_NAMESPACE::Basename((*it)->name);
        string output_file =
            GOOGLE_NAMESPACE::PathJoin(FLAG_header_dir,
                                basename + FLAG_outputfile_suffix);
        vector<string> template_filenames;   // Contains one template filename.
        template_filenames.push_back((*it)->name);
        string output = Boilerplate(progname, template_filenames);
        output.append(WrapWithGuard(output_file, (*it)->header_entries));
        if (!WriteToDisk(FLAG_log_info, output_file, output))
          num_errors++;
      }
    }
  }

  // Free dynamic memory
  for (vector<TemplateRecord*>::iterator it = template_records.begin();
       it != template_records.end(); ++it) {
    delete *it;
  }

  // Cap at 127 to avoid causing problems with return code
  return num_errors > 127 ? 127 : num_errors;
}